

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O3

REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,char *geom_filename)

{
  REF_GEOM ref_geom;
  int iVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  REF_NODE pRVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  REF_INT gref;
  REF_INT nedge;
  REF_INT ntri;
  REF_INT new_cell;
  REF_DBL param [2];
  REF_INT edges [2];
  char line [1024];
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  int local_4cc;
  undefined8 local_4c8;
  uint local_4c0;
  uint local_4bc;
  undefined1 local_458 [16];
  REF_INT local_440 [2];
  undefined4 local_438;
  short local_434;
  undefined1 uStack_432;
  
  ref_geom = ref_grid->geom;
  local_458 = (undefined1  [16])0x0;
  if (geom_filename != (char *)0x0) {
    printf("parsing %s\n");
    __stream = fopen(geom_filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",geom_filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
             0x7c,"ref_meshlink_parse","unable to open file");
      return 2;
    }
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      do {
        geom_filename = (char *)&local_4c8;
        iVar1 = __isoc99_fscanf(__stream,"%s",&local_438);
        if (iVar1 != 1) {
          if (iVar1 != -1) {
            lVar10 = (long)iVar1;
            pcVar8 = "line read failed";
            uVar7 = 1;
            uVar6 = 0x80;
LAB_0017a90a:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,uVar6,"ref_meshlink_parse",pcVar8,uVar7,lVar10);
            return 1;
          }
          break;
        }
        if (local_434 == 0x74 && local_438 == 0x65656873) {
          iVar1 = __isoc99_fscanf(__stream,"%d %d",&local_4d0,&local_4d8);
          if (iVar1 != 2) {
            lVar10 = (long)iVar1;
            pcVar8 = "sheet size gref";
            uVar7 = 2;
            uVar6 = 0x83;
            goto LAB_0017a90a;
          }
          printf("sheet ntri %d gref %d\n",(ulong)local_4d0,(ulong)local_4d8);
          if (0 < (int)local_4d0) {
            iVar1 = 0;
            do {
              iVar3 = __isoc99_fscanf(__stream,"%d %d %d",&local_4c8,(long)&local_4c8 + 4,&local_4c0
                                     );
              if (iVar3 != 3) {
                lVar10 = (long)iVar3;
                pcVar8 = "tri nodes";
                uVar7 = 3;
                uVar6 = 0x87;
                goto LAB_0017a90a;
              }
              local_4c8 = CONCAT44((int)((ulong)local_4c8 >> 0x20) + -1,(int)local_4c8 + -1);
              local_4c0 = local_4c0 - 1;
              local_4bc = local_4d8;
              uVar2 = ref_cell_with(ref_grid->cell[3],(REF_INT *)&local_4c8,&local_4cc);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "tri for sheet missing";
                uVar6 = 0x8d;
                goto LAB_0017a8a2;
              }
              ref_grid->cell[3]->c2n[(long)local_4cc * (long)ref_grid->cell[3]->size_per + 3] =
                   local_4bc;
              uVar2 = ref_geom_add(ref_geom,(REF_INT)local_4c8,2,local_4bc,(REF_DBL *)local_458);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "face uv";
                uVar6 = 0x90;
                goto LAB_0017a8a2;
              }
              uVar2 = ref_geom_add(ref_geom,local_4c8._4_4_,2,local_4bc,(REF_DBL *)local_458);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "face uv";
                uVar6 = 0x92;
                goto LAB_0017a8a2;
              }
              uVar2 = ref_geom_add(ref_geom,local_4c0,2,local_4bc,(REF_DBL *)local_458);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "face uv";
                uVar6 = 0x94;
                goto LAB_0017a8a2;
              }
              iVar1 = iVar1 + 1;
            } while (iVar1 < (int)local_4d0);
          }
        }
        if (CONCAT13(uStack_432,CONCAT21(local_434,local_438._3_1_)) == 0x676e69 &&
            local_438 == 0x69727473) {
          iVar1 = __isoc99_fscanf(__stream,"%d %d",&local_4d4,&local_4d8);
          if (iVar1 != 2) {
            lVar10 = (long)iVar1;
            pcVar8 = "string size gref";
            uVar7 = 2;
            uVar6 = 0x99;
            goto LAB_0017a90a;
          }
          printf("sheet ntri %d gref %d\n",(ulong)local_4d4,(ulong)local_4d8);
          if (0 < (int)local_4d4) {
            iVar1 = 0;
            do {
              iVar3 = __isoc99_fscanf(__stream,"%d %d",&local_4c8,(long)&local_4c8 + 4);
              if (iVar3 != 2) {
                lVar10 = (long)iVar3;
                pcVar8 = "edge nodes";
                uVar7 = 2;
                uVar6 = 0x9c;
                goto LAB_0017a90a;
              }
              local_4c8 = CONCAT44((int)((ulong)local_4c8 >> 0x20) + -1,(int)local_4c8 + -1);
              local_4c0 = local_4d8;
              uVar2 = ref_cell_add(ref_grid->cell[0],(REF_INT *)&local_4c8,&local_4cc);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "add edg for string";
                uVar6 = 0xa1;
LAB_0017a8a2:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                       ,uVar6,"ref_meshlink_parse",uVar9,pcVar8);
                return (REF_STATUS)uVar9;
              }
              uVar2 = ref_geom_add(ref_geom,(REF_INT)local_4c8,1,local_4c0,(REF_DBL *)local_458);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "edge t";
                uVar6 = 0xa3;
                goto LAB_0017a8a2;
              }
              uVar2 = ref_geom_add(ref_geom,local_4c8._4_4_,1,local_4c0,(REF_DBL *)local_458);
              if (uVar2 != 0) {
                uVar9 = (ulong)uVar2;
                pcVar8 = "edge t";
                uVar6 = 0xa5;
                goto LAB_0017a8a2;
              }
              iVar1 = iVar1 + 1;
            } while (iVar1 < (int)local_4d4);
          }
        }
        geom_filename = (char *)&local_4c8;
        iVar1 = feof(__stream);
      } while (iVar1 == 0);
    }
    fclose(__stream);
    pRVar4 = ref_grid->node;
    if (0 < pRVar4->max) {
      lVar10 = 0;
      do {
        if (-1 < pRVar4->global[lVar10]) {
          uVar2 = ref_cell_id_list_around
                            (ref_grid->cell[0],(REF_INT)lVar10,2,(REF_INT *)&local_4d4,local_440);
          if ((uVar2 != 0) && (uVar2 != 7)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,0xb2,"ref_meshlink_parse",(ulong)uVar2,"count edgeids");
            geom_filename = (char *)(ulong)uVar2;
          }
          if ((uVar2 != 7) && (uVar2 != 0)) {
            return (REF_STATUS)geom_filename;
          }
          pRVar4 = ref_grid->node;
          if (1 < (int)local_4d4) {
            lVar5 = 0xffffffff;
            if ((lVar10 < pRVar4->max) && (lVar5 = pRVar4->global[lVar10], lVar5 < 0)) {
              lVar5 = -1;
            }
            uVar2 = ref_geom_add(ref_geom,(REF_INT)lVar10,0,(REF_INT)lVar5,(REF_DBL *)local_458);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                     ,0xb5,"ref_meshlink_parse",(ulong)uVar2,"node");
              return uVar2;
            }
            pRVar4 = ref_grid->node;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pRVar4->max);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,
                                      const char *geom_filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *f = NULL;
  char line[1024];
  REF_INT tri, ntri, edge, nedge, gref, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  int status;
  REF_DBL param[2] = {0.0, 0.0};
  if (NULL == geom_filename) return REF_SUCCESS;
  printf("parsing %s\n", geom_filename);
  f = fopen(geom_filename, "r");
  if (NULL == (void *)f) printf("unable to open %s\n", geom_filename);
  RNS(f, "unable to open file");
  while (!feof(f)) {
    status = fscanf(f, "%s", line);
    if (EOF == status) break;
    REIS(1, status, "line read failed");

    if (0 == strcmp("sheet", line)) {
      REIS(2, fscanf(f, "%d %d", &ntri, &gref), "sheet size gref");
      printf("sheet ntri %d gref %d\n", ntri, gref);
      for (tri = 0; tri < ntri; tri++) {
        REIS(3, fscanf(f, "%d %d %d", &(nodes[0]), &(nodes[1]), &(nodes[2])),
             "tri nodes");
        (nodes[0])--;
        (nodes[1])--;
        (nodes[2])--;
        nodes[3] = gref;
        RSS(ref_cell_with(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri for sheet missing");
        ref_cell_c2n(ref_grid_tri(ref_grid), 3, new_cell) = nodes[3];
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], param),
            "face uv");
      }
    }

    if (0 == strcmp("string", line)) {
      REIS(2, fscanf(f, "%d %d", &nedge, &gref), "string size gref");
      printf("sheet ntri %d gref %d\n", nedge, gref);
      for (edge = 0; edge < nedge; edge++) {
        REIS(2, fscanf(f, "%d %d", &(nodes[0]), &(nodes[1])), "edge nodes");
        (nodes[0])--;
        (nodes[1])--;
        nodes[2] = gref;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "add edg for string");
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
      }
    }
  }
  fclose(f);

  { /* mark cad nodes */
    REF_INT node;
    REF_INT edges[2];
    REF_INT id;
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RXS(ref_cell_id_list_around(ref_grid_edg(ref_grid), node, 2, &nedge,
                                  edges),
          REF_INCREASE_LIMIT, "count edgeids");
      if (nedge > 1) {
        id = (REF_INT)ref_node_global(ref_grid_node(ref_grid), node);
        RSS(ref_geom_add(ref_geom, node, REF_GEOM_NODE, id, param), "node");
      }
    }
  }

  return REF_SUCCESS;
}